

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
::key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
          (key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           *this,key_type *name,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *args)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (this + 0x20),args);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }